

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
PMsgIRCCommand::trigger
          (PMsgIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name_00;
  char *pcVar1;
  PMsgIRCCommand *pPVar2;
  size_t sVar3;
  bool bVar4;
  byte bVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  size_t local_1a8;
  char *local_1a0;
  string local_178;
  __sv_type local_158;
  PMsgIRCCommand *local_148;
  size_t sStack_140;
  __sv_type local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  Server *server;
  undefined4 uStack_108;
  uint i;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  char local_d1;
  undefined1 local_d0 [7];
  char prefix;
  string msg;
  PlayerInfo *player;
  string_view name;
  undefined1 local_78 [4];
  int type;
  size_t local_68;
  char *local_60;
  undefined1 auStack_58 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  IRC_Bot *source_local;
  PMsgIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (PMsgIRCCommand *)nick._M_len;
  nick_local._M_str = (char *)channel._M_len;
  local_68 = parameters._M_len;
  local_60 = parameters._M_str;
  in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
  command_split.second._M_str = (char *)source;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_78," \t");
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)auStack_58,(jessilib *)&local_68,
             (basic_string_view<char,_std::char_traits<char>_> *)local_78,in_whitespace);
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&command_split.first._M_str
                    );
  sVar3 = nick_local._M_len;
  pPVar2 = this_local;
  pcVar1 = command_split.second._M_str;
  if (bVar4) {
    bVar10 = sv("Error: Too Few Parameters. Syntax: PMsg <Player> <Message>",0x3a);
    local_1a8 = bVar10._M_len;
    local_1a0 = bVar10._M_str;
    Jupiter::IRC::Client::sendNotice(pcVar1,pPVar2,sVar3,local_1a8,local_1a0);
  }
  else {
    channel_local._M_len._0_4_ = channel._M_str._0_4_;
    channel_local._M_len._4_4_ = channel._M_str._4_4_;
    Jupiter::IRC::Client::getChannel(command_split.second._M_str,nick_local._M_str,channel._M_str);
    Jupiter::IRC::Client::Channel::getType();
    std::__cxx11::string::string((string *)local_d0);
    local_e8 = nick_local._M_str._0_4_;
    uStack_e4 = nick_local._M_str._4_4_;
    uStack_e0 = (undefined4)channel_local._M_len;
    uStack_dc = channel_local._M_len._4_4_;
    uVar6 = Jupiter::IRC::Client::getChannel
                      (command_split.second._M_str,nick_local._M_str,channel._M_str);
    uStack_108 = this_local._0_4_;
    i = this_local._4_4_;
    uStack_100 = (undefined4)nick_local._M_len;
    uStack_fc = nick_local._M_len._4_4_;
    local_d1 = Jupiter::IRC::Client::Channel::getUserPrefix(uVar6,this_local,nick_local._M_len);
    if (local_d1 != '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 local_d1);
    }
    std::__cxx11::string::operator+=
              ((string *)local_d0,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
               "@IRC: ");
    std::__cxx11::string::operator+=
              ((string *)local_d0,
               (basic_string_view<char,_std::char_traits<char>_> *)&command_split.first._M_str);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
    if (!bVar4) {
      server._4_4_ = 0;
      while( true ) {
        uVar8 = (ulong)server._4_4_;
        RenX::getCore();
        uVar7 = RenX::Core::getServerCount();
        if (uVar8 == uVar7) break;
        uVar8 = RenX::getCore();
        local_118 = RenX::Core::getServer(uVar8);
        bVar5 = RenX::Server::isLogChanType((int)local_118);
        if ((bVar5 & 1) != 0) {
          player._0_4_ = auStack_58._0_4_;
          player._4_4_ = auStack_58._4_4_;
          name._M_len._0_4_ = (undefined4)command_split.first._M_len;
          name._M_len._4_4_ = (undefined4)(command_split.first._M_len >> 0x20);
          local_128 = player._0_4_;
          uStack_124 = player._4_4_;
          uStack_120 = (undefined4)name._M_len;
          uStack_11c = name._M_len._4_4_;
          lVar9 = RenX::Server::getPlayerByPartName(local_118,auStack_58,command_split.first._M_len)
          ;
          pcVar1 = command_split.second._M_str;
          uVar6 = local_118;
          msg.field_2._8_8_ = lVar9;
          if (lVar9 == 0) {
            local_148 = this_local;
            sStack_140 = nick_local._M_len;
            name_00._M_str = (char *)command_split.first._M_len;
            name_00._M_len = (size_t)auStack_58;
            player_not_found_message_abi_cxx11_(&local_178,name_00);
            local_158 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_178);
            Jupiter::IRC::Client::sendNotice
                      (pcVar1,local_148,sStack_140,local_158._M_len,local_158._M_str);
            std::__cxx11::string::~string((string *)&local_178);
          }
          else {
            local_138 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d0)
            ;
            RenX::Server::sendMessage(uVar6,lVar9,local_138._M_len,local_138._M_str);
          }
        }
        server._4_4_ = server._4_4_ + 1;
      }
    }
    std::__cxx11::string::~string((string *)local_d0);
  }
  return;
}

Assistant:

void PMsgIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!command_split.second.empty())
	{
		int type = source->getChannel(channel)->getType();

		std::string_view name = command_split.first;
		RenX::PlayerInfo *player;
		std::string msg;
		char prefix = source->getChannel(channel)->getUserPrefix(nick);
		if (prefix != '\0')
			msg += prefix;
		msg += nick;
		msg += "@IRC: ";
		msg += command_split.second;
		if (!parameters.empty())
		{
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					player = server->getPlayerByPartName(name);
					if (player != nullptr) {
						server->sendMessage(*player, msg);
					}
					else {
						source->sendNotice(nick, player_not_found_message(name));
					}
				}
			}
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: PMsg <Player> <Message>"sv);
}